

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall QPDFArgParser::handleBashArguments(QPDFArgParser *this)

{
  char *__s;
  bool bVar1;
  int iVar2;
  reference pcVar3;
  ulong uVar4;
  element_type *peVar5;
  element_type *peVar6;
  size_type sVar7;
  __shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar8;
  element_type *ppcVar9;
  size_type local_f0;
  ulong local_e8;
  size_t i;
  allocator<char> local_c9;
  string local_c8;
  shared_ptr<char> local_a8;
  shared_ptr<const_char> local_98;
  shared_ptr<char> local_88;
  shared_ptr<const_char> local_78;
  byte local_65;
  bool append;
  char local_51;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_50;
  char ch;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  string arg;
  anon_enum_32 state;
  bool last_was_backslash;
  QPDFArgParser *this_local;
  
  arg.field_2._M_local_buf[0xf] = '\0';
  arg.field_2._8_4_ = 0;
  std::__cxx11::string::string((string *)&__range1);
  std::__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)this);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_50._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb0), bVar1) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_51 = *pcVar3;
    if ((arg.field_2._M_local_buf[0xf] & 1U) == 0) {
      if (local_51 == '\\') {
        arg.field_2._M_local_buf[0xf] = '\x01';
      }
      else {
        local_65 = 0;
        if (arg.field_2._8_4_ == 0) {
          bVar1 = ::qpdf::util::is_space(local_51);
          if (bVar1) {
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              peVar5 = std::
                       __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)this);
              QUtil::make_shared_cstr((QUtil *)&local_88,(string *)&__range1);
              std::shared_ptr<char_const>::shared_ptr<char,void>
                        ((shared_ptr<char_const> *)&local_78,&local_88);
              std::
              vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>::
              push_back(&peVar5->bash_argv,(value_type *)&local_78);
              std::shared_ptr<const_char>::~shared_ptr(&local_78);
              std::shared_ptr<char>::~shared_ptr(&local_88);
              std::__cxx11::string::clear();
            }
          }
          else if (local_51 == '\"') {
            arg.field_2._8_4_ = 2;
          }
          else if (local_51 == '\'') {
            arg.field_2._8_4_ = 1;
          }
          else {
            local_65 = 1;
          }
        }
        else if (arg.field_2._8_4_ == 1) {
          local_65 = local_51 != '\'';
          if (!(bool)local_65) {
            arg.field_2._8_4_ = 0;
          }
        }
        else if ((arg.field_2._8_4_ == 2) && (local_65 = local_51 != '\"', !(bool)local_65)) {
          arg.field_2._8_4_ = 0;
        }
        if ((local_65 & 1) != 0) {
          std::__cxx11::string::append((ulong)&__range1,'\x01');
        }
      }
    }
    else {
      std::__cxx11::string::append((ulong)&__range1,'\x01');
      arg.field_2._M_local_buf[0xf] = '\0';
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar1 = std::vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>::
          empty(&peVar5->bash_argv);
  if (bVar1) {
    peVar5 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar6 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    __s = *peVar6->argv;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,__s,&local_c9);
    QUtil::make_shared_cstr((QUtil *)&local_a8,&local_c8);
    std::shared_ptr<char_const>::shared_ptr<char,void>
              ((shared_ptr<char_const> *)&local_98,&local_a8);
    std::vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>::
    push_back(&peVar5->bash_argv,(value_type *)&local_98);
    std::shared_ptr<const_char>::~shared_ptr(&local_98);
    std::shared_ptr<char>::~shared_ptr(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
  }
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  sVar7 = std::vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>::
          size(&peVar5->bash_argv);
  QUtil::make_shared_array<char_const*>((QUtil *)&i,sVar7 + 1);
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<const_char_*>::operator=(&peVar5->bash_argv_ph,(shared_ptr<const_char_*> *)&i);
  std::shared_ptr<const_char_*>::~shared_ptr((shared_ptr<const_char_*> *)&i);
  local_e8 = 0;
  while( true ) {
    uVar4 = local_e8;
    peVar5 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    sVar7 = std::vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
            ::size(&peVar5->bash_argv);
    if (sVar7 <= uVar4) break;
    peVar5 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    this_00 = &std::
               vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>::
               at(&peVar5->bash_argv,local_e8)->
               super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>;
    peVar8 = std::__shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    peVar5 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    ppcVar9 = std::__shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>::get
                        (&(peVar5->bash_argv_ph).
                          super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>);
    ppcVar9[local_e8] = peVar8;
    local_e8 = local_e8 + 1;
  }
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  local_f0 = std::vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
             ::size(&peVar5->bash_argv);
  iVar2 = QIntC::to_int<unsigned_long>(&local_f0);
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar5->argc = iVar2;
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  ppcVar9 = std::__shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>::get
                      (&(peVar5->bash_argv_ph).
                        super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>);
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  ppcVar9[peVar5->argc] = (element_type)0x0;
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  ppcVar9 = std::__shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>::get
                      (&(peVar5->bash_argv_ph).
                        super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>);
  peVar5 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar5->argv = ppcVar9;
  std::__cxx11::string::~string((string *)&__range1);
  return;
}

Assistant:

void
QPDFArgParser::handleBashArguments()
{
    // Do a minimal job of parsing bash_line into arguments. This doesn't do everything the shell
    // does (e.g. $(...), variable expansion, arithmetic, globs, etc.), but it should be good enough
    // for purposes of handling completion. As we build up the new argv, we can't use m->new_argv
    // because this code has to interoperate with @file arguments, so memory for both ways of
    // fabricating argv has to be protected.

    bool last_was_backslash = false;
    enum { st_top, st_squote, st_dquote } state = st_top;
    std::string arg;
    for (char ch: m->bash_line) {
        if (last_was_backslash) {
            arg.append(1, ch);
            last_was_backslash = false;
        } else if (ch == '\\') {
            last_was_backslash = true;
        } else {
            bool append = false;
            switch (state) {
            case st_top:
                if (util::is_space(ch)) {
                    if (!arg.empty()) {
                        m->bash_argv.push_back(QUtil::make_shared_cstr(arg));
                        arg.clear();
                    }
                } else if (ch == '"') {
                    state = st_dquote;
                } else if (ch == '\'') {
                    state = st_squote;
                } else {
                    append = true;
                }
                break;

            case st_squote:
                if (ch == '\'') {
                    state = st_top;
                } else {
                    append = true;
                }
                break;

            case st_dquote:
                if (ch == '"') {
                    state = st_top;
                } else {
                    append = true;
                }
                break;
            }
            if (append) {
                arg.append(1, ch);
            }
        }
    }
    if (m->bash_argv.empty()) {
        // This can't happen if properly invoked by bash, but ensure we have a valid argv[0]
        // regardless.
        m->bash_argv.push_back(QUtil::make_shared_cstr(m->argv[0]));
    }
    // Explicitly discard any non-space-terminated word. The "current word" is handled specially.
    m->bash_argv_ph = QUtil::make_shared_array<char const*>(1 + m->bash_argv.size());
    for (size_t i = 0; i < m->bash_argv.size(); ++i) {
        m->bash_argv_ph.get()[i] = m->bash_argv.at(i).get();
    }
    m->argc = QIntC::to_int(m->bash_argv.size());
    m->bash_argv_ph.get()[m->argc] = nullptr;
    m->argv = m->bash_argv_ph.get();
}